

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O1

ssize_t __thiscall SystemCatalog::write(SystemCatalog *this,int __fd,void *__buf,size_t __n)

{
  undefined1 *puVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  _Base_ptr p_Var6;
  type k;
  type local_88;
  
  puVar1 = &this->field_0x48;
  std::ostream::seekp(puVar1,0,0);
  std::ostream::write(puVar1,(long)this);
  p_Var6 = (_Base_ptr)std::ostream::seekp(puVar1,4,0);
  p_Var4 = (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->types)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var2) {
    paVar3 = &local_88.typeName.field_2;
    p_Var6 = p_Var4;
    do {
      local_88.typeName._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,*(long *)(p_Var6 + 1),
                 (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
      local_88.primaryKey = *(uint8_t *)&p_Var6[2]._M_left;
      local_88._32_8_ = *(undefined8 *)(p_Var6 + 2);
      local_88.cardinality = (uint64_t)p_Var6[2]._M_parent;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_88.fieldsName,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var6[2]._M_right);
      local_88.dir = (directory *)p_Var6[3]._M_left;
      uVar5 = std::ostream::tellp();
      type::write(&local_88,(int)this + 0x38,(void *)(ulong)uVar5,__n);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88.fieldsName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.typeName._M_dataplus._M_p != paVar3) {
        operator_delete(local_88.typeName._M_dataplus._M_p,
                        local_88.typeName.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var2);
  }
  return (ssize_t)p_Var6;
}

Assistant:

void SystemCatalog::write() {

    writeNumTypes();

    catalogFile.seekp(NUM_TYPES);

    for (auto k: types) {
        k.write(catalogFile, (int) catalogFile.tellp());
    }
}